

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::protos::gen::ConsoleConfig::~ConsoleConfig(ConsoleConfig *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ConsoleConfig_00407568;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  return;
}

Assistant:

ConsoleConfig::~ConsoleConfig() = default;